

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int pkcs7_wrap(scep *s,int enc_base64)

{
  ulong uVar1;
  X509 *x509;
  int iVar2;
  uint uVar3;
  uint len;
  int *piVar4;
  X509 *bp;
  long lVar5;
  X509 *certs;
  X509 *in;
  BIO_METHOD *pBVar6;
  char **ppcVar7;
  X509 *pXVar8;
  X509 *p7si;
  ASN1_OBJECT *pAVar9;
  BIO *append;
  BIO *b;
  BIO *pBVar10;
  ulong uVar11;
  char *pcVar12;
  ASN1_STRING *pAVar13;
  size_t sVar14;
  X509_ATTRIBUTE *pXVar15;
  char *pcVar16;
  ASN1_STRING *str;
  PKCS7 *pPVar17;
  stack_st_PKCS7_SIGNER_INFO *psVar18;
  FILE *pFVar19;
  FILE *pFVar20;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar21;
  FILE *b_00;
  X509 **ppXVar22;
  void *__src;
  ASN1_TYPE *pAVar23;
  X509_CRL *x;
  X509_NAME *pXVar24;
  X509_NAME *b_01;
  FILE *pFVar25;
  ASN1_INTEGER *x_00;
  X509_EXTENSION *pXVar26;
  ulong uVar27;
  X509 **parg;
  EVP_MD *pEVar28;
  int *piVar29;
  EVP_PKEY **buffer_00;
  ulong uVar30;
  uint extraout_EDX;
  char *__s;
  char *data;
  FILE *extraout_RDX;
  undefined8 uVar31;
  X509 *pXVar32;
  FILE *pFVar33;
  char *pcVar34;
  ASN1_STRING *pAVar35;
  X509 *pXVar36;
  char **ppcVar37;
  uchar *buffer;
  uint uStack_26a4;
  PKCS7 *pPStack_26a0;
  BIO *pBStack_2698;
  long lStack_2690;
  byte abStack_2688 [64];
  char acStack_2648 [1024];
  char acStack_2248 [1032];
  FILE *pFStack_1e40;
  int *piStack_1e38;
  X509 *pXStack_1e30;
  FILE *pFStack_1e28;
  char **ppcStack_1e20;
  FILE *pFStack_1e18;
  int aiStack_1e10 [258];
  FILE *pFStack_1a08;
  int *piStack_1a00;
  X509 *pXStack_19f8;
  X509_CRL *pXStack_19f0;
  FILE *pFStack_19e8;
  FILE *pFStack_19e0;
  FILE aFStack_19d8 [4];
  FILE aFStack_15d8 [4];
  char acStack_11d8 [2056];
  FILE *pFStack_9d0;
  FILE *pFStack_9c8;
  FILE *pFStack_9c0;
  X509_CRL *pXStack_9b8;
  FILE *pFStack_9b0;
  FILE *pFStack_9a8;
  X509_CRL *pXStack_998;
  FILE *pFStack_990;
  FILE *pFStack_988;
  FILE *pFStack_980;
  X509_CRL *pXStack_978;
  FILE *pFStack_970;
  code *pcStack_968;
  X509_CRL *pXStack_958;
  FILE *pFStack_950;
  FILE *pFStack_948;
  FILE *pFStack_940;
  FILE *pFStack_938;
  FILE *pFStack_930;
  undefined1 auStack_920 [1040];
  ASN1_STRING *pAStack_510;
  FILE *pFStack_508;
  X509_STORE *pXStack_500;
  X509_STORE_CTX *pXStack_4f8;
  FILE *pFStack_4f0;
  FILE *pFStack_4e8;
  undefined1 auStack_4e0 [1032];
  ASN1_STRING *pAStack_d8;
  ASN1_STRING *pAStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  code *pcStack_b0;
  X509 *pXStack_a8;
  X509 *pXStack_a0;
  ASN1_STRING *pAStack_90;
  code *pcStack_88;
  X509 *pXStack_78;
  scep *psStack_70;
  X509 *pXStack_68;
  X509 *pXStack_60;
  X509 *local_50;
  char **local_48;
  X509 *local_40;
  X509 *local_38;
  
  local_50 = (X509 *)0x0;
  s->sender_nonce_len = 0x10;
  pXStack_60 = (X509 *)0x10c2bd;
  piVar4 = (int *)malloc(0x10);
  pXStack_60 = (X509 *)0x10c2cd;
  RAND_bytes((uchar *)piVar4,0x10);
  s->sender_nonce = (uchar *)piVar4;
  uVar3 = 0x111418;
  switch(s->request_type) {
  case 0x13:
    s->request_type_str = "19";
    ppcVar7 = (char **)s->signercert;
    certs = (X509 *)s->signerkey;
    piVar4 = &d_flag;
    if (d_flag != 0) {
      pXStack_60 = (X509 *)0x10c327;
      uVar3 = 0x111418;
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pXStack_60 = (X509 *)0x10c32c;
    pBVar6 = BIO_s_mem();
    pXStack_60 = (X509 *)0x10c334;
    bp = (X509 *)BIO_new(pBVar6);
    pXStack_60 = (X509 *)0x10c349;
    in = (X509 *)request;
    pXVar8 = bp;
    iVar2 = i2d_X509_REQ_bio((BIO *)bp,(X509_REQ *)request);
    if (0 < iVar2) {
      pXVar8 = certs;
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c372;
        printf("%s: inner PKCS#7 in mem BIO \n",pname);
      }
      goto LAB_0010c470;
    }
    goto LAB_0010ca61;
  case 0x14:
    goto switchD_0010c2ee_caseD_14;
  case 0x15:
    break;
  case 0x16:
    goto switchD_0010c2ee_caseD_16;
  default:
    goto switchD_0010c2ee_default;
  }
  s->request_type_str = "21";
  pXVar8 = (X509 *)rsa;
  ppcVar7 = (char **)localcert;
  pXStack_60 = (X509 *)0x10c39b;
  pBVar6 = BIO_s_mem();
  pXStack_60 = (X509 *)0x10c3a3;
  bp = (X509 *)BIO_new(pBVar6);
  pXStack_60 = (X509 *)0x10c3b5;
  iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcert);
  if (iVar2 != 0) goto LAB_0010c470;
  pXStack_60 = (X509 *)0x10c3c2;
  pkcs7_wrap_cold_2();
switchD_0010c2ee_caseD_16:
  s->request_type_str = "22";
  pXVar8 = (X509 *)rsa;
  ppcVar7 = (char **)localcert;
  pXStack_60 = (X509 *)0x10c3e6;
  pBVar6 = BIO_s_mem();
  pXStack_60 = (X509 *)0x10c3ee;
  bp = (X509 *)BIO_new(pBVar6);
  pXStack_60 = (X509 *)0x10c400;
  iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcrl);
  if (iVar2 == 0) {
    pXStack_60 = (X509 *)0x10c409;
    pkcs7_wrap_cold_1();
switchD_0010c2ee_caseD_14:
    s->request_type_str = "20";
    ppcVar7 = (char **)s->signercert;
    pXVar8 = (X509 *)s->signerkey;
    if (d_flag != 0) {
      pXStack_60 = (X509 *)0x10c440;
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pXStack_60 = (X509 *)0x10c445;
    pBVar6 = BIO_s_mem();
    pXStack_60 = (X509 *)0x10c44d;
    bp = (X509 *)BIO_new(pBVar6);
    pXStack_60 = (X509 *)0x10c45f;
    iVar2 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio((BIO *)bp,s->ias_getcertinit);
    if (iVar2 == 0) {
      pXStack_60 = (X509 *)0x10c468;
      pkcs7_wrap_cold_3();
switchD_0010c2ee_default:
      bp = (X509 *)0x0;
      ppcVar7 = (char **)0x0;
      pXVar8 = (X509 *)0x0;
    }
  }
LAB_0010c470:
  pXStack_60 = (X509 *)0x10c481;
  lVar5 = BIO_ctrl((BIO *)bp,0xb,0,(void *)0x0);
  if ((int)lVar5 < 1) {
    pXStack_60 = (X509 *)0x10ca1b;
    pkcs7_wrap_cold_5();
  }
  pXStack_60 = (X509 *)0x10c4a0;
  local_40 = pXVar8;
  local_38 = (X509 *)ppcVar7;
  BIO_set_flags((BIO *)bp,0x200);
  ppcVar37 = &s->request_payload;
  pXVar32 = (X509 *)0x3;
  pXStack_60 = (X509 *)0x10c4bb;
  local_48 = ppcVar37;
  lVar5 = BIO_ctrl((BIO *)bp,3,0,ppcVar37);
  s->request_len = (int)lVar5;
  if (v_flag != 0) {
    pXStack_60 = (X509 *)0x10c4e6;
    printf("%s: request data dump \n",pname);
    pXStack_60 = (X509 *)0x10c4ff;
    pXVar32 = (X509 *)request;
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
    piVar4 = (int *)&pname;
    if (v_flag != 0) {
      pXStack_60 = (X509 *)0x10c523;
      pXVar32 = (X509 *)pname;
      printf("%s: data payload size: %d bytes\n",pname,(ulong)(uint)s->request_len);
    }
  }
  pcVar34 = (char *)0x0;
  pXStack_60 = (X509 *)0x10c52a;
  certs = (X509 *)OPENSSL_sk_new();
  uVar3 = (uint)ppcVar37;
  if (certs == (X509 *)0x0) {
    pXStack_60 = (X509 *)0x10ca25;
    pkcs7_wrap_cold_19();
LAB_0010ca25:
    in = pXVar32;
    pXStack_60 = (X509 *)0x10ca2a;
    pkcs7_wrap_cold_17();
LAB_0010ca2a:
    pXVar32 = (X509 *)piVar4;
    pXStack_60 = (X509 *)0x10ca2f;
    pkcs7_wrap_cold_16();
    certs = pXVar8;
LAB_0010ca2f:
    pXStack_60 = (X509 *)0x10ca34;
    pkcs7_wrap_cold_15();
LAB_0010ca34:
    pXVar8 = (X509 *)pcVar34;
    pXStack_60 = (X509 *)0x10ca39;
    pkcs7_wrap_cold_14();
LAB_0010ca39:
    pXStack_60 = (X509 *)0x10ca3e;
    pkcs7_wrap_cold_13();
LAB_0010ca3e:
    p7si = pXVar32;
    pXStack_60 = (X509 *)0x10ca43;
    pkcs7_wrap_cold_12();
LAB_0010ca43:
    pXStack_60 = (X509 *)0x10ca48;
    pkcs7_wrap_cold_11();
LAB_0010ca48:
    pXStack_60 = (X509 *)0x10ca4d;
    pkcs7_wrap_cold_10();
LAB_0010ca4d:
    piVar4 = (int *)p7si;
    pXStack_60 = (X509 *)0x10ca52;
    pkcs7_wrap_cold_9();
LAB_0010ca52:
    pXStack_60 = (X509 *)0x10ca57;
    pkcs7_wrap_cold_7();
LAB_0010ca57:
    pXStack_60 = (X509 *)0x10ca5c;
    pkcs7_wrap_cold_8();
  }
  else {
    if (encert != (X509 *)0x0) {
      pXStack_60 = (X509 *)0x10c54d;
      iVar2 = OPENSSL_sk_push(certs);
      if (iVar2 < 1) {
        pXStack_60 = (X509 *)0x10c556;
        pkcs7_wrap_cold_6();
        goto LAB_0010c556;
      }
LAB_0010c570:
      uVar3 = (uint)ppcVar37;
      if (d_flag != 0) {
        piVar4 = (int *)0x0;
        pXStack_60 = (X509 *)0x10c597;
        printf("\n %s: hexdump request payload\n",pname);
        uVar3 = (uint)ppcVar37;
        if (0 < s->request_len) {
          piVar4 = (int *)0x0;
          do {
            pXStack_60 = (X509 *)0x10c5bf;
            printf("%02x",(ulong)(uint)(int)s->request_payload[(long)piVar4]);
            uVar3 = (uint)ppcVar37;
            piVar4 = (int *)((long)&((X509 *)piVar4)->cert_info + 1);
          } while ((long)piVar4 < (long)s->request_len);
        }
        ppcVar7 = &pname;
        pXStack_60 = (X509 *)0x10c5e9;
        printf("\n %s: hexdump payload %d \n",pname,(ulong)piVar4 & 0xffffffff);
      }
      pcVar34 = s->request_payload;
      pXVar32 = (X509 *)(ulong)(uint)s->request_len;
      pXStack_60 = (X509 *)0x10c5fc;
      in = (X509 *)BIO_new_mem_buf(pcVar34,s->request_len);
      pXVar8 = certs;
      if (in == (X509 *)0x0) goto LAB_0010ca25;
      uVar3 = 0x80;
      pXStack_60 = (X509 *)0x10c61f;
      pcVar34 = (char *)certs;
      pXVar32 = (X509 *)PKCS7_encrypt((stack_st_X509 *)certs,(BIO *)in,(EVP_CIPHER *)enc_alg,0x80);
      if (pXVar32 == (X509 *)0x0) goto LAB_0010ca2a;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c64f;
        printf("%s: successfully encrypted payload\n",pname);
      }
      pXStack_60 = (X509 *)0x10c654;
      pBVar6 = BIO_s_mem();
      pXStack_60 = (X509 *)0x10c65c;
      ppcVar7 = (char **)BIO_new(pBVar6);
      pXStack_60 = (X509 *)0x10c66a;
      in = pXVar32;
      pcVar34 = (char *)ppcVar7;
      iVar2 = i2d_PKCS7_bio((BIO *)ppcVar7,(PKCS7 *)pXVar32);
      if (iVar2 < 1) goto LAB_0010ca2f;
      pXStack_60 = (X509 *)0x10c683;
      BIO_ctrl((BIO *)ppcVar7,0xb,0,(void *)0x0);
      pXStack_60 = (X509 *)0x10c690;
      BIO_set_flags((BIO *)ppcVar7,0x200);
      parg = &local_50;
      in = (X509 *)0x3;
      pXStack_60 = (X509 *)0x10c6a4;
      certs = (X509 *)BIO_ctrl((BIO *)ppcVar7,3,0,parg);
      uVar3 = (uint)parg;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c6cd;
        in = (X509 *)pname;
        printf("%s: envelope size: %d bytes\n",pname,(ulong)certs & 0xffffffff);
      }
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c6f1;
        printf("%s: printing PEM fomatted PKCS#7\n",pname);
        pXStack_60 = (X509 *)0x10c703;
        in = pXVar32;
        PEM_write_PKCS7(_stdout,(PKCS7 *)pXVar32);
      }
      pXStack_60 = (X509 *)0x10c70b;
      pcVar34 = (char *)ppcVar7;
      BIO_free((BIO *)ppcVar7);
      if (v_flag != 0) {
        pcVar34 = "%s: creating outer PKCS#7\n";
        pXStack_60 = (X509 *)0x10c72f;
        in = (X509 *)pname;
        printf("%s: creating outer PKCS#7\n");
      }
      pXStack_60 = (X509 *)0x10c734;
      pXVar8 = (X509 *)PKCS7_new();
      s->request_p7 = (PKCS7 *)pXVar8;
      if (pXVar8 == (X509 *)0x0) goto LAB_0010ca34;
      in = (X509 *)0x16;
      pXStack_60 = (X509 *)0x10c751;
      iVar2 = PKCS7_set_type((PKCS7 *)pXVar8,0x16);
      x509 = local_38;
      if (iVar2 == 0) goto LAB_0010ca39;
      pXStack_60 = (X509 *)0x10c76d;
      PKCS7_add_certificate((PKCS7 *)s->request_p7,local_38);
      pXVar8 = (X509 *)s->request_p7;
      pXStack_60 = (X509 *)0x10c78b;
      pEVar28 = sig_alg;
      in = x509;
      p7si = (X509 *)PKCS7_add_signature((PKCS7 *)pXVar8,x509,(EVP_PKEY *)local_40,(EVP_MD *)sig_alg
                                        );
      uVar3 = (uint)pEVar28;
      pXVar32 = x509;
      if (p7si == (X509 *)0x0) goto LAB_0010ca3e;
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c7bc;
        printf("%s: signature added successfully\n",pname);
        if (d_flag != 0) {
          pXStack_60 = (X509 *)0x10c7da;
          printf("%s: adding signed attributes\n",pname);
        }
      }
      pXStack_60 = (X509 *)0x10c7df;
      ppcVar7 = (char **)OPENSSL_sk_new_null();
      pXStack_60 = (X509 *)0x10c7f7;
      add_attribute_string((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_transId,s->transaction_id);
      pXStack_60 = (X509 *)0x10c80c;
      add_attribute_string((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_messageType,s->request_type_str);
      pXStack_60 = (X509 *)0x10c825;
      add_attribute_octet((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_senderNonce,s->sender_nonce,
                          s->sender_nonce_len);
      pXStack_60 = (X509 *)0x10c830;
      PKCS7_set_signed_attributes((PKCS7_SIGNER_INFO *)p7si,(stack_st_X509_ATTRIBUTE *)ppcVar7);
      pXStack_60 = (X509 *)0x10c83a;
      pAVar9 = OBJ_nid2obj(0x15);
      in = (X509 *)0x32;
      pXStack_60 = (X509 *)0x10c84f;
      pXVar8 = p7si;
      iVar2 = PKCS7_add_signed_attribute((PKCS7_SIGNER_INFO *)p7si,0x32,6,pAVar9);
      uVar3 = (uint)pAVar9;
      if (iVar2 == 0) goto LAB_0010ca43;
      pXVar8 = (X509 *)s->request_p7;
      in = (X509 *)0x15;
      pXStack_60 = (X509 *)0x10c868;
      iVar2 = PKCS7_content_new((PKCS7 *)pXVar8,0x15);
      if (iVar2 == 0) goto LAB_0010ca48;
      pXVar8 = (X509 *)s->request_p7;
      in = (X509 *)0x0;
      pXStack_60 = (X509 *)0x10c87e;
      piVar4 = (int *)PKCS7_dataInit((PKCS7 *)pXVar8,(BIO *)0x0);
      if ((X509 *)piVar4 == (X509 *)0x0) goto LAB_0010ca4d;
      pXStack_60 = (X509 *)0x10c899;
      in = local_50;
      pXVar8 = (X509 *)piVar4;
      iVar2 = BIO_write((BIO *)piVar4,local_50,(int)certs);
      if (iVar2 != (int)certs) goto LAB_0010ca52;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c8c5;
        printf("%s: PKCS#7 data written successfully\n",pname);
      }
      pXVar8 = (X509 *)s->request_p7;
      pXStack_60 = (X509 *)0x10c8d4;
      in = (X509 *)piVar4;
      iVar2 = PKCS7_dataFinal((PKCS7 *)pXVar8,(BIO *)piVar4);
      if (iVar2 != 0) {
        if (d_flag != 0) {
          pXStack_60 = (X509 *)0x10c900;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pXStack_60 = (X509 *)0x10c916;
          PEM_write_PKCS7(_stdout,(PKCS7 *)s->request_p7);
        }
        if ((enc_base64 != 0) && (v_flag != 0)) {
          pXStack_60 = (X509 *)0x10c93f;
          printf("%s: applying base64 encoding\n",pname);
        }
        pXStack_60 = (X509 *)0x10c944;
        pBVar6 = BIO_s_mem();
        pXStack_60 = (X509 *)0x10c94c;
        append = BIO_new(pBVar6);
        pXStack_60 = (X509 *)0x10c954;
        pBVar6 = BIO_f_base64();
        pXStack_60 = (X509 *)0x10c95c;
        b = BIO_new(pBVar6);
        pBVar10 = append;
        if (enc_base64 != 0) {
          pXStack_60 = (X509 *)0x10c96f;
          pBVar10 = BIO_push(b,append);
        }
        pXStack_60 = (X509 *)0x10c981;
        i2d_PKCS7_bio(pBVar10,(PKCS7 *)s->request_p7);
        pXStack_60 = (X509 *)0x10c992;
        BIO_ctrl(pBVar10,0xb,0,(void *)0x0);
        pXStack_60 = (X509 *)0x10c99f;
        BIO_set_flags(append,0x200);
        pXStack_60 = (X509 *)0x10c9b3;
        uVar11 = BIO_ctrl(append,3,0,local_48);
        s->request_len = (int)uVar11;
        if (v_flag != 0) {
          pcVar34 = "";
          if (enc_base64 != 0) {
            pcVar34 = "base64 encoded ";
          }
          pXStack_60 = (X509 *)0x10c9f5;
          printf("%s: %spayload size: %d bytes\n",pname,pcVar34,uVar11 & 0xffffffff);
        }
        pXStack_60 = (X509 *)0x10c9fd;
        BIO_free(pBVar10);
        pXStack_60 = (X509 *)0x10ca05;
        BIO_free((BIO *)bp);
        return 0;
      }
      goto LAB_0010ca57;
    }
LAB_0010c556:
    pXStack_60 = (X509 *)0x10c568;
    in = (X509 *)cacert;
    pXVar8 = certs;
    iVar2 = OPENSSL_sk_push();
    uVar3 = (uint)ppcVar37;
    if (0 < iVar2) goto LAB_0010c570;
  }
  pXStack_60 = (X509 *)0x10ca61;
  pkcs7_wrap_cold_18();
LAB_0010ca61:
  pXStack_60 = (X509 *)add_attribute_string;
  pkcs7_wrap_cold_4();
  pcVar34 = pname;
  pXStack_78 = (X509 *)piVar4;
  psStack_70 = s;
  pXStack_68 = bp;
  pXStack_60 = certs;
  if (d_flag != 0) {
    pcStack_88 = (code *)0x10ca92;
    pcVar12 = OBJ_nid2sn((int)in);
    pcStack_88 = (code *)0x10caa6;
    printf("%s: adding string attribute %s\n",pcVar34,pcVar12);
  }
  pcStack_88 = (code *)0x10caab;
  pAVar13 = ASN1_STRING_new();
  pcStack_88 = (code *)0x10cab6;
  sVar14 = strlen(__s);
  pcStack_88 = (code *)0x10cac3;
  pcVar34 = __s;
  pAVar35 = pAVar13;
  iVar2 = ASN1_STRING_set(pAVar13,__s,(int)sVar14);
  if (0 < iVar2) {
    pcStack_88 = (code *)0x10cad6;
    pXVar15 = X509_ATTRIBUTE_create((int)in,0x13,pAVar13);
    pcStack_88 = (code *)0x10cae1;
    OPENSSL_sk_push(pXVar8,pXVar15);
    return 0;
  }
  pcStack_88 = add_attribute_octet;
  add_attribute_string_cold_1();
  pcVar12 = pname;
  pXStack_a8 = pXVar8;
  pXStack_a0 = (X509 *)ppcVar7;
  pAStack_90 = pAVar13;
  pcStack_88 = (code *)((ulong)in & 0xffffffff);
  if (d_flag != 0) {
    pcStack_b0 = (code *)0x10cb23;
    pcVar16 = OBJ_nid2sn((int)pcVar34);
    pcStack_b0 = (code *)0x10cb37;
    printf("%s: adding octet attribute %s\n",pcVar12,pcVar16);
  }
  pcStack_b0 = (code *)0x10cb3c;
  str = ASN1_STRING_new();
  pcStack_b0 = (code *)0x10cb4d;
  pcVar12 = data;
  pAVar13 = str;
  iVar2 = ASN1_STRING_set(str,data,uVar3);
  if (0 < iVar2) {
    pcStack_b0 = (code *)0x10cb60;
    pXVar15 = X509_ATTRIBUTE_create((int)pcVar34,4,str);
    pcStack_b0 = (code *)0x10cb6b;
    OPENSSL_sk_push(pAVar35,pXVar15);
    return 0;
  }
  pcStack_b0 = pkcs7_verify_unwrap;
  add_attribute_octet_cold_1();
  pFStack_4e8 = (FILE *)0x10cb97;
  pAStack_d8 = pAVar35;
  pAStack_d0 = str;
  uStack_c8 = (ulong)(uint)enc_base64;
  uStack_c0 = (ulong)uVar3;
  pcStack_b0 = (code *)((ulong)pcVar34 & 0xffffffff);
  pBVar6 = BIO_s_mem();
  pFStack_4e8 = (FILE *)0x10cb9f;
  pBVar10 = BIO_new(pBVar6);
  if (v_flag != 0) {
    pFStack_4e8 = (FILE *)0x10cbc6;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_4e8 = (FILE *)0x10cbdb;
  uVar3 = BIO_write(pBVar10,*(void **)(pAVar13 + 8),*(int *)&pAVar13[8].data);
  if ((int)uVar3 < 1) {
    pFStack_4e8 = (FILE *)0x10cf65;
    pkcs7_verify_unwrap_cold_12();
LAB_0010cf65:
    pFStack_4e8 = (FILE *)0x10cf6a;
    pkcs7_verify_unwrap_cold_11();
LAB_0010cf6a:
    pFStack_4e8 = (FILE *)0x10cf6f;
    pkcs7_verify_unwrap_cold_1();
LAB_0010cf6f:
    pFStack_4e8 = (FILE *)0x10cf74;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_4e8 = (FILE *)0x10cc09;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_4e8 = (FILE *)0x10cc16;
    BIO_set_flags(pBVar10,0x200);
    pFStack_4e8 = (FILE *)0x10cc20;
    pPVar17 = d2i_PKCS7_bio(pBVar10,(PKCS7 **)0x0);
    pAVar13[7].flags = (long)pPVar17;
    if (pPVar17 == (PKCS7 *)0x0) goto LAB_0010cf65;
    if (d_flag != 0) {
      pFStack_4e8 = (FILE *)0x10cc54;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_4e8 = (FILE *)0x10cc6a;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar13[7].flags);
      pPVar17 = (PKCS7 *)pAVar13[7].flags;
    }
    pFStack_4e8 = (FILE *)0x10cc7a;
    iVar2 = OBJ_obj2nid(pPVar17->type);
    if (iVar2 != 0x16) goto LAB_0010cf6a;
    pFStack_4e8 = (FILE *)0x10cc91;
    pBVar10 = PKCS7_dataInit((PKCS7 *)pAVar13[7].flags,(BIO *)0x0);
    if (pBVar10 == (BIO *)0x0) goto LAB_0010cf6f;
    pFStack_4e8 = (FILE *)0x10cca2;
    pBVar6 = BIO_s_mem();
    pFStack_4e8 = (FILE *)0x10ccaa;
    ppcVar7 = (char **)BIO_new(pBVar6);
    pFStack_4e8 = (FILE *)0x10ccbd;
    uVar3 = BIO_read(pBVar10,auStack_4e0,0x400);
    len = uVar3;
    while (0 < (int)len) {
      pFStack_4e8 = (FILE *)0x10ccd5;
      BIO_write((BIO *)ppcVar7,auStack_4e0,len);
      pFStack_4e8 = (FILE *)0x10cce5;
      len = BIO_read(pBVar10,auStack_4e0,0x400);
      uVar3 = uVar3 + len;
    }
    pFStack_4e8 = (FILE *)0x10ccfc;
    BIO_ctrl((BIO *)ppcVar7,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_4e8 = (FILE *)0x10cd22;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_4e8 = (FILE *)0x10cd2e;
    psVar18 = PKCS7_get_signer_info((PKCS7 *)pAVar13[7].flags);
    if (psVar18 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_4e8 = (FILE *)0x10cd5e;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_4e8 = (FILE *)0x10cd68;
      pFVar19 = (FILE *)OPENSSL_sk_value(psVar18,0);
      pFStack_4e8 = (FILE *)0x10cd7a;
      pFVar20 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar13[7].flags,(PKCS7_SIGNER_INFO *)pFVar19);
      if (pFVar20 == (FILE *)0x0) {
        pFStack_4e8 = (FILE *)0x10cd9a;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_4e8 = (FILE *)0x10cdaf;
      iVar2 = PKCS7_signatureVerify
                        (pBVar10,(PKCS7 *)pAVar13[7].flags,(PKCS7_SIGNER_INFO *)pFVar19,
                         (X509 *)pFVar20);
      if (iVar2 < 1) goto LAB_0010cf79;
      if (v_flag != 0) {
        pFStack_4e8 = (FILE *)0x10cddb;
        printf("%s: signature ok\n");
      }
      pFStack_4e8 = (FILE *)0x10cde0;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_4e8 = (FILE *)0x10cf3d;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_4e8 = (FILE *)0x10cdf6;
      X509_STORE_set_flags(ctx,0);
      pFStack_4e8 = (FILE *)0x10ce03;
      X509_STORE_load_locations(ctx,pcVar12,(char *)0x0);
      pFStack_4e8 = (FILE *)0x10ce08;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_4e8 = (FILE *)0x10cf47;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_4e8 = (FILE *)0x10ce24;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar20,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_4e8 = (FILE *)0x10cf51;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_4e8 = (FILE *)0x10ce34;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_4e8 = (FILE *)0x10cf5b;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar21 = pFVar19;
      if (w_flag == 0) {
LAB_0010cefa:
        pFStack_4e8 = (FILE *)0x10cf04;
        pFVar25 = (FILE *)ppcVar7;
        pPVar17 = d2i_PKCS7_bio((BIO *)ppcVar7,(PKCS7 **)0x0);
        pAVar13[7].flags = (long)pPVar17;
        if (pPVar17 != (PKCS7 *)0x0) {
          pFStack_4e8 = (FILE *)0x10cf1c;
          X509_STORE_free(ctx);
          pFStack_4e8 = (FILE *)0x10cf24;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_4e8 = (FILE *)0x10cfaf;
        pkcs7_verify_unwrap_cold_8();
        pFVar19 = pFVar21;
LAB_0010cfaf:
        pFVar21 = pFVar19;
        pFStack_4e8 = (FILE *)0x10cfb4;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_4e8 = (FILE *)0x10ce62;
        pFVar25 = (FILE *)w_char;
        pFVar21 = fopen(w_char,"w");
        if (pFVar21 == (FILE *)0x0) goto LAB_0010cfaf;
        if (v_flag != 0) {
          pFStack_4e8 = (FILE *)0x10ce92;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_4e8 = (FILE *)0x10ceb0;
          PEM_write_X509(_stdout,(X509 *)pFVar20);
        }
        pFStack_4e8 = (FILE *)0x10cebb;
        pFVar25 = pFVar21;
        iVar2 = PEM_write_X509(pFVar21,(X509 *)pFVar20);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_4e8 = (FILE *)0x10cef2;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_4e8 = (FILE *)0x10cefa;
          fclose(pFVar21);
          goto LAB_0010cefa;
        }
      }
      pFStack_4e8 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_930 = (FILE *)0x10cfd2;
      pAStack_510 = pAVar13;
      pFStack_508 = pFVar20;
      pXStack_500 = ctx;
      pXStack_4f8 = ctx_00;
      pFStack_4f0 = (FILE *)ppcVar7;
      pFStack_4e8 = pFVar21;
      pBVar6 = BIO_s_mem();
      pFStack_930 = (FILE *)0x10cfda;
      pFVar19 = (FILE *)BIO_new(pBVar6);
      piVar4 = &v_flag;
      if (v_flag != 0) {
        pFStack_930 = (FILE *)0x10d003;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar33 = *(FILE **)&pFVar25->_mode;
      pFStack_930 = (FILE *)0x10d018;
      pcVar34 = (char *)pFVar19;
      uVar3 = BIO_write((BIO *)pFVar19,pFVar33,*(int *)(pFVar25->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_930 = (FILE *)0x10d6bd;
        pkcs7_unwrap_cold_20();
LAB_0010d6bd:
        pFStack_930 = (FILE *)0x10d6c2;
        pkcs7_unwrap_cold_1();
LAB_0010d6c2:
        pFStack_930 = (FILE *)0x10d6c7;
        pkcs7_unwrap_cold_19();
LAB_0010d6c7:
        pFStack_930 = (FILE *)0x10d6cc;
        pkcs7_unwrap_cold_18();
LAB_0010d6cc:
        pFStack_930 = (FILE *)0x10d6d1;
        pkcs7_unwrap_cold_17();
LAB_0010d6d1:
        pFStack_930 = (FILE *)0x10d6d6;
        pkcs7_unwrap_cold_16();
LAB_0010d6d6:
        pcVar12 = (char *)pFVar20;
        pFStack_930 = (FILE *)0x10d6db;
        pkcs7_unwrap_cold_2();
LAB_0010d6db:
        pFStack_930 = (FILE *)0x10d6e0;
        pkcs7_unwrap_cold_3();
LAB_0010d6e0:
        pFStack_930 = (FILE *)0x10d6e5;
        pkcs7_unwrap_cold_4();
LAB_0010d6e5:
        pFStack_930 = (FILE *)0x10d6ea;
        pkcs7_unwrap_cold_5();
LAB_0010d6ea:
        pFStack_930 = (FILE *)0x10d6ef;
        pkcs7_unwrap_cold_6();
LAB_0010d6ef:
        pFStack_930 = (FILE *)0x10d6f4;
        pkcs7_unwrap_cold_8();
LAB_0010d6f4:
        pFStack_930 = (FILE *)0x10d6f9;
        pkcs7_unwrap_cold_14();
LAB_0010d6f9:
        pFVar20 = pFVar21;
        pFStack_930 = (FILE *)0x10d6fe;
        pkcs7_unwrap_cold_13();
LAB_0010d6fe:
        pFStack_930 = (FILE *)0x10d703;
        pkcs7_unwrap_cold_12();
LAB_0010d703:
        pFStack_930 = (FILE *)0x10d708;
        pkcs7_unwrap_cold_15();
        pFVar21 = pFVar20;
LAB_0010d708:
        pFStack_930 = (FILE *)0x10d70d;
        pkcs7_unwrap_cold_9();
        auStack_920._0_8_ = pcVar34;
      }
      else {
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d041;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
        }
        pFStack_930 = (FILE *)0x10d04e;
        BIO_set_flags((BIO *)pFVar19,0x200);
        pFVar33 = (FILE *)0x0;
        pFStack_930 = (FILE *)0x10d058;
        pPVar17 = d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
        pFVar25->__pad5 = (size_t)pPVar17;
        piVar29 = &d_flag;
        buffer_00 = (EVP_PKEY **)piVar29;
        if (d_flag != 0) {
          pFStack_930 = (FILE *)0x10d083;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar33 = (FILE *)pFVar25->__pad5;
          pFStack_930 = (FILE *)0x10d099;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar33);
          pPVar17 = (PKCS7 *)pFVar25->__pad5;
          buffer_00 = (EVP_PKEY **)piVar29;
        }
        pcVar34 = (char *)pPVar17->type;
        pFStack_930 = (FILE *)0x10d0a9;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar34);
        if (iVar2 != 0x16) goto LAB_0010d6bd;
        pcVar34 = (char *)pFVar25->__pad5;
        pFVar33 = (FILE *)0x0;
        pFStack_930 = (FILE *)0x10d0c0;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar34,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d6c2;
        pFStack_930 = (FILE *)0x10d0d1;
        pBVar6 = BIO_s_mem();
        pFStack_930 = (FILE *)0x10d0d9;
        pFVar19 = (FILE *)BIO_new(pBVar6);
        pFStack_930 = (FILE *)0x10d0ee;
        uVar3 = BIO_read((BIO *)b_00,auStack_920 + 8,0x400);
        pFVar33 = (FILE *)(ulong)uVar3;
        pFVar21 = pFVar33;
        if (0 < (int)uVar3) {
          pFVar20 = (FILE *)(auStack_920 + 8);
          do {
            pFStack_930 = (FILE *)0x10d108;
            BIO_write((BIO *)pFVar19,pFVar20,(int)pFVar33);
            pFStack_930 = (FILE *)0x10d118;
            uVar3 = BIO_read((BIO *)b_00,pFVar20,0x400);
            pFVar33 = (FILE *)(ulong)uVar3;
            pFVar21 = (FILE *)(ulong)((int)pFVar21 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar33 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_930 = (FILE *)0x10d12f;
        BIO_ctrl((BIO *)pFVar19,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d150;
          pFVar33 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar21);
        }
        pcVar34 = (char *)pFVar25->__pad5;
        pFStack_930 = (FILE *)0x10d15c;
        psVar18 = PKCS7_get_signer_info((PKCS7 *)pcVar34);
        ppcVar7 = (char **)b_00;
        if (psVar18 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d6c7;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d187;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_930 = (FILE *)0x10d191;
        pFVar20 = (FILE *)OPENSSL_sk_value(psVar18,0);
        pFVar33 = (FILE *)pFVar25->__pad5;
        pFStack_930 = (FILE *)0x10d1b0;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar34 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar33,(PKCS7_SIGNER_INFO *)pFVar20,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d6cc;
        if (v_flag != 0) {
          pcVar34 = "%s: signature ok\n";
          pFStack_930 = (FILE *)0x10d1d7;
          pFVar33 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar34 = "%s: finding signed attributes\n";
          pFStack_930 = (FILE *)0x10d1fb;
          pFVar33 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        ppcVar7 = (char **)pFVar20->_IO_read_base;
        if ((FILE *)ppcVar7 == (FILE *)0x0) goto LAB_0010d6d1;
        pFVar33 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d224;
        pcVar34 = (char *)ppcVar7;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_transId,0x13,(char **)buffer_00);
        pcVar12 = (char *)auStack_920._0_8_;
        if (iVar2 != 0) goto LAB_0010d6d6;
        pFStack_930 = (FILE *)0x10d24c;
        printf("%s: reply transaction id: %s\n",pname,auStack_920._0_8_);
        piVar4 = (int *)pFVar25->_IO_buf_end;
        pFStack_930 = (FILE *)0x10d258;
        sVar14 = strlen(pcVar12);
        pFStack_930 = (FILE *)0x10d266;
        pFVar33 = (FILE *)pcVar12;
        pcVar34 = (char *)piVar4;
        iVar2 = strncmp((char *)piVar4,pcVar12,sVar14);
        if (iVar2 != 0) goto LAB_0010d6db;
        pFVar33 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d289;
        pcVar34 = (char *)ppcVar7;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_messageType,0x13,
                           (char **)buffer_00);
        piVar4 = &v_flag;
        if (iVar2 != 0) goto LAB_0010d6e0;
        pFStack_930 = (FILE *)0x10d2a2;
        pcVar34 = (char *)auStack_920._0_8_;
        iVar2 = atoi((char *)auStack_920._0_8_);
        if (iVar2 != 3) goto LAB_0010d6e5;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d2ca;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_930 = (FILE *)0x10d2e5;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_senderNonce,4,(char **)auStack_920
                          );
        if (v_flag != 0 && iVar2 != 0) {
          pFStack_930 = (FILE *)0x10d6a5;
          fprintf(_stderr,"%s: cannot find senderNonce\n",pname);
        }
        iVar2 = v_flag;
        pFVar25->_markers = (_IO_marker *)auStack_920._0_8_;
        if (iVar2 != 0) {
          pFStack_930 = (FILE *)0x10d323;
          printf("%s: senderNonce in reply: ",pname);
          pcVar12 = "%02X";
          lVar5 = 0;
          do {
            pFStack_930 = (FILE *)0x10d340;
            printf("%02X",(ulong)*(byte *)((long)&pFVar25->_markers->_next + lVar5));
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x10);
          pFStack_930 = (FILE *)0x10d353;
          putchar(10);
        }
        piVar4 = &v_flag;
        pFVar33 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d375;
        pcVar34 = (char *)ppcVar7;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_recipientNonce,4,
                           (char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d6ea;
        pFVar25->_IO_save_end = (char *)auStack_920._0_8_;
        pFVar20 = (FILE *)auStack_920._0_8_;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d3a5;
          printf("%s: recipientNonce in reply: ",pname);
          lVar5 = 0;
          do {
            pFStack_930 = (FILE *)0x10d3c2;
            printf("%02X",(ulong)(byte)pFVar25->_IO_save_end[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x10);
          pFStack_930 = (FILE *)0x10d3d5;
          putchar(10);
          pFVar20 = (FILE *)pFVar25->_IO_save_end;
        }
        piVar4 = &v_flag;
        pcVar12 = (char *)&pFVar25->_mode;
        lVar5 = 0;
        do {
          if (pFVar25->_IO_save_base[lVar5] != *(char *)((long)&pFVar20->_flags + lVar5)) {
            if (v_flag != 0) {
              pFStack_930 = (FILE *)0x10d6b3;
              pkcs7_unwrap_cold_7();
            }
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        pFVar33 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d428;
        pcVar34 = (char *)ppcVar7;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_pkiStatus,0x13,(char **)buffer_00)
        ;
        if (iVar2 != 0) goto LAB_0010d6ef;
        pFStack_930 = (FILE *)0x10d43a;
        pcVar34 = (char *)auStack_920._0_8_;
        iVar2 = atoi((char *)auStack_920._0_8_);
        if (iVar2 == 3) {
          pFStack_930 = (FILE *)0x10d534;
          printf("%s: pkistatus: PENDING\n",pname);
          *(undefined4 *)&pFVar25->_IO_write_base = 3;
LAB_0010d53b:
          if (v_flag == 0) {
            return 0;
          }
          if ((int)pFVar21 == 0) {
            return 0;
          }
          pFStack_930 = (FILE *)0x10d553;
          pkcs7_unwrap_cold_11();
          return 0;
        }
        if (iVar2 != 2) {
          pFVar20 = pFVar21;
          if (iVar2 == 0) {
            pcVar34 = "%s: pkistatus: SUCCESS\n";
            pFStack_930 = (FILE *)0x10d468;
            pFVar33 = (FILE *)pname;
            printf("%s: pkistatus: SUCCESS\n");
            *(undefined4 *)&pFVar25->_IO_write_base = 0;
LAB_0010d4fa:
            if ((int)pFVar21 == 0) goto LAB_0010d6f4;
            if (pFVar25->_flags - 0x13U < 2) {
              ppXVar22 = (X509 **)&pFVar25->_fileno;
              buffer_00 = (EVP_PKEY **)&pFVar25->_old_offset;
            }
            else {
              ppXVar22 = &localcert;
              buffer_00 = &rsa;
            }
            ppcVar7 = (char **)*buffer_00;
            piVar4 = (int *)*ppXVar22;
            pFVar33 = (FILE *)0x0;
            pFStack_930 = (FILE *)0x10d570;
            pcVar34 = (char *)pFVar19;
            pFVar20 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
            if (pFVar20 == (FILE *)0x0) goto LAB_0010d6f9;
            if (d_flag != 0) {
              pFStack_930 = (FILE *)0x10d5a0;
              printf("%s: printing PEM fomatted PKCS#7\n",pname);
              pFStack_930 = (FILE *)0x10d5b2;
              PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar20);
            }
            pFStack_930 = (FILE *)0x10d5b7;
            pBVar6 = BIO_s_mem();
            pFStack_930 = (FILE *)0x10d5bf;
            pFVar19 = (FILE *)BIO_new(pBVar6);
            if (d_flag != 0) {
              pFStack_930 = (FILE *)0x10d5e6;
              printf("%s: decrypting inner PKCS#7\n",pname);
            }
            pFStack_930 = (FILE *)0x10d5fa;
            buffer_00 = (EVP_PKEY **)pFVar19;
            pFVar33 = (FILE *)ppcVar7;
            pcVar34 = (char *)pFVar20;
            iVar2 = PKCS7_decrypt((PKCS7 *)pFVar20,(EVP_PKEY *)ppcVar7,(X509 *)piVar4,(BIO *)pFVar19
                                  ,0);
            if (iVar2 != 0) {
              pFStack_930 = (FILE *)0x10d613;
              BIO_ctrl((BIO *)pFVar19,0xb,0,(void *)0x0);
              pFStack_930 = (FILE *)0x10d625;
              uVar11 = BIO_ctrl((BIO *)pFVar19,3,0,pcVar12);
              *(int *)(pFVar25->_unused2 + 4) = (int)uVar11;
              if (v_flag != 0) {
                pFStack_930 = (FILE *)0x10d651;
                printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar11 & 0xffffffff);
              }
              pFStack_930 = (FILE *)0x10d65e;
              BIO_set_flags((BIO *)pFVar19,0x200);
              pFStack_930 = (FILE *)0x10d668;
              pPVar17 = d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
              pFVar25->__pad5 = (size_t)pPVar17;
              return 0;
            }
            goto LAB_0010d6fe;
          }
          goto LAB_0010d703;
        }
        pFStack_930 = (FILE *)0x10d48c;
        printf("%s: pkistatus: FAILURE\n",pname);
        *(undefined4 *)&pFVar25->_IO_write_base = 2;
        pFVar33 = (FILE *)(ulong)(uint)nid_failInfo;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d4ae;
        pcVar34 = (char *)ppcVar7;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar7,nid_failInfo,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d708;
        pFStack_930 = (FILE *)0x10d4c0;
        uVar3 = atoi((char *)auStack_920._0_8_);
        if (uVar3 < 5) {
          buffer_00 = (EVP_PKEY **)(ulong)uVar3;
          iVar2 = *(int *)(&DAT_00111428 + (long)buffer_00 * 4);
          *(uint *)&pFVar25->_IO_write_end = uVar3;
          pcVar34 = "%s: reason: %s\n";
          pFStack_930 = (FILE *)0x10d4f4;
          pFVar33 = (FILE *)pname;
          printf("%s: reason: %s\n",pname,&DAT_00111428 + iVar2);
          if (*(int *)&pFVar25->_IO_write_base != 0) goto LAB_0010d53b;
          goto LAB_0010d4fa;
        }
      }
      pFStack_930 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_10();
      pcStack_968 = (code *)0x10d72d;
      pFStack_950 = pFVar25;
      pFStack_948 = (FILE *)pcVar12;
      pFStack_940 = pFVar19;
      pFStack_938 = (FILE *)ppcVar7;
      pFStack_930 = pFVar21;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)auStack_920._0_8_,(int)pFVar33,
                            (ASN1_TYPE **)&pXStack_958);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_968 = (code *)0x10d802;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_968 = (code *)0x10d764;
      ppcVar37 = (char **)pXStack_958;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pXStack_958);
      if (uVar3 == extraout_EDX) {
        pcStack_968 = (code *)0x10d775;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pXStack_958->sig_alg);
        if ((int)uVar3 < 1) {
          return 1;
        }
        ppcVar7 = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_968 = (code *)0x10d7a3;
          pFVar33 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,ppcVar7);
        }
        ppcVar37 = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_968 = (code *)0x10d7b4;
        pcVar34 = (char *)malloc((size_t)ppcVar37);
        *buffer_00 = (EVP_PKEY *)pcVar34;
        if (pcVar34 != (char *)0x0) {
          pcStack_968 = (code *)0x10d7c8;
          __src = (void *)ASN1_STRING_get0_data(pXStack_958->sig_alg);
          pcStack_968 = (code *)0x10d7d9;
          memcpy(pcVar34,__src,(size_t)ppcVar7);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)ppcVar7] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_968 = (code *)0x10d80c;
        get_signed_attribute_cold_2();
      }
      pcStack_968 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar34 = pname;
      pXStack_978 = pXStack_958;
      pFVar20 = (FILE *)((ulong)pFVar33 & 0xffffffff);
      pFStack_988 = (FILE *)buffer_00;
      pFStack_980 = (FILE *)pcVar12;
      pFStack_970 = (FILE *)ppcVar7;
      pcStack_968 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_990 = (FILE *)0x10d83e;
        pcVar16 = OBJ_nid2sn((int)pFVar33);
        pFStack_990 = (FILE *)0x10d852;
        printf("%s: finding attribute %s\n",pcVar34,pcVar16);
        ppcVar7 = (char **)pcVar34;
      }
      *(long *)extraout_RDX = 0;
      pFStack_990 = (FILE *)0x10d860;
      pFVar19 = pFVar20;
      pFVar21 = (FILE *)OBJ_nid2obj((int)pFVar33);
      if (pFVar21 != (FILE *)0x0) {
        pFStack_990 = (FILE *)0x10d870;
        iVar2 = OPENSSL_sk_num(ppcVar37);
        if (0 < iVar2) {
          pFVar20 = (FILE *)0x0;
          do {
            pFStack_990 = (FILE *)0x10d880;
            pcVar12 = (char *)OPENSSL_sk_value(ppcVar37,pFVar20);
            pFStack_990 = (FILE *)0x10d88b;
            pAVar9 = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar12);
            pFStack_990 = (FILE *)0x10d896;
            iVar2 = OBJ_cmp(pAVar9,(ASN1_OBJECT *)pFVar21);
            if (iVar2 == 0) {
              pFStack_990 = (FILE *)0x10d8a2;
              pFVar19 = (FILE *)pcVar12;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar12);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_990 = (FILE *)0x10d8de;
                  get_attribute_cold_1();
                  ppcVar7 = (char **)pFVar21;
                  goto LAB_0010d8de;
                }
                pFStack_990 = (FILE *)0x10d8b6;
                pAVar23 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar12,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar23;
              }
            }
            uVar3 = (int)pFVar20 + 1;
            pFVar20 = (FILE *)(ulong)uVar3;
            pFStack_990 = (FILE *)0x10d8c3;
            iVar2 = OPENSSL_sk_num(ppcVar37);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d8de:
      pFStack_990 = (FILE *)0x10d8e3;
      get_attribute_cold_2();
      pFVar19 = *(FILE **)(*(long *)(pFVar19->__pad5 + 0x20) + 0x18);
      pFStack_9a8 = (FILE *)0x10d8ff;
      pXStack_998 = (X509_CRL *)ppcVar37;
      pFStack_990 = (FILE *)ppcVar7;
      x = (X509_CRL *)OPENSSL_sk_value(pFVar19,0);
      if (x == (X509_CRL *)0x0) {
        pFStack_9a8 = (FILE *)0x10d9ac;
        write_crl_cold_3();
LAB_0010d9ac:
        pFStack_9a8 = (FILE *)0x10d9b1;
        write_crl_cold_2();
        pFVar21 = extraout_RDX;
      }
      else {
        ppcVar7 = &w_char;
        pFStack_9a8 = (FILE *)0x10d921;
        pFVar19 = (FILE *)w_char;
        pFVar21 = fopen(w_char,"w");
        ppcVar37 = (char **)x;
        if (pFVar21 == (FILE *)0x0) goto LAB_0010d9ac;
        if (v_flag != 0) {
          pFStack_9a8 = (FILE *)0x10d951;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_9a8 = (FILE *)0x10d96f;
          PEM_write_X509_CRL(_stdout,x);
        }
        pFStack_9a8 = (FILE *)0x10d97a;
        pFVar19 = pFVar21;
        iVar2 = PEM_write_X509_CRL(pFVar21,x);
        if (iVar2 == 1) {
          pFStack_9a8 = (FILE *)0x10d99a;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar21);
          return iVar2;
        }
      }
      pFStack_9a8 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar19 = *(FILE **)(*(long *)(pFVar19->__pad5 + 0x20) + 0x10);
      pFStack_9d0 = pFVar21;
      pFStack_9c8 = (FILE *)pcVar12;
      pFStack_9c0 = (FILE *)piVar4;
      pXStack_9b8 = (X509_CRL *)ppcVar37;
      pFStack_9b0 = (FILE *)ppcVar7;
      pFStack_9a8 = pFVar20;
      if (v_flag != 0) {
        pFStack_19e0 = (FILE *)0x10d9f7;
        uVar3 = OPENSSL_sk_num(pFVar19);
        pFStack_19e0 = (FILE *)0x10da07;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_19e0 = (FILE *)0x10da0f;
      pFVar21 = pFVar19;
      iVar2 = OPENSSL_sk_num();
      pXVar8 = (X509 *)localcert;
      if (0 < iVar2) {
        ppcVar37 = (char **)0x0;
        do {
          pFStack_19e0 = (FILE *)0x10da25;
          pXVar8 = (X509 *)OPENSSL_sk_value(pFVar19,ppcVar37);
          pcVar34 = pname;
          if (v_flag != 0) {
            pFStack_19e0 = (FILE *)0x10da45;
            pXVar24 = X509_get_subject_name(pXVar8);
            pFStack_19e0 = (FILE *)0x10da58;
            pcVar12 = X509_NAME_oneline(pXVar24,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10da6c;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar34,pcVar12);
            pFStack_19e0 = (FILE *)0x10da74;
            pXVar24 = X509_get_issuer_name(pXVar8);
            pFStack_19e0 = (FILE *)0x10da84;
            pcVar34 = X509_NAME_oneline(pXVar24,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10da95;
            printf("  issuer: %s\n",pcVar34);
            pFStack_19e0 = (FILE *)0x10daa1;
            pXVar24 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_19e0 = (FILE *)0x10dab1;
            pcVar34 = X509_NAME_oneline(pXVar24,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10dac2;
            printf("  request_subject: \'%s\'\n",pcVar34);
            pFVar20 = aFStack_19d8;
          }
          pFStack_19e0 = (FILE *)0x10daca;
          pXVar24 = X509_get_subject_name(pXVar8);
          pFStack_19e0 = (FILE *)0x10dad9;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_19e0 = (FILE *)0x10dae4;
          iVar2 = X509_NAME_cmp(pXVar24,b_01);
          if (d_flag != 0) {
            pFStack_19e0 = (FILE *)0x10dbc5;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010db6a:
            if (v_flag != 0) {
              pFStack_19e0 = (FILE *)0x10db7d;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_19e0 = (FILE *)0x10db04;
            pXVar24 = X509_get_subject_name(pXVar8);
            pFStack_19e0 = (FILE *)0x10db1c;
            X509_NAME_oneline(pXVar24,acStack_11d8,0x400);
            pFStack_19e0 = (FILE *)0x10db28;
            pXVar24 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar20 = aFStack_15d8;
            pFStack_19e0 = (FILE *)0x10db40;
            X509_NAME_oneline(pXVar24,(char *)pFVar20,0x400);
            if (v_flag != 0) {
              pFStack_19e0 = (FILE *)0x10db5b;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar20,acStack_11d8);
            }
            pFStack_19e0 = (FILE *)0x10db66;
            iVar2 = strcmp(acStack_11d8,(char *)pFVar20);
            if (iVar2 == 0) goto LAB_0010db6a;
            pFStack_19e0 = (FILE *)0x10dbcf;
            write_local_cert_cold_2();
          }
          pFStack_19e0 = (FILE *)0x10db85;
          ppcVar7 = (char **)X509_get_subject_name(pXVar8);
          pFStack_19e0 = (FILE *)0x10db90;
          pXVar24 = X509_get_issuer_name(pXVar8);
          pFStack_19e0 = (FILE *)0x10db9b;
          pFVar21 = (FILE *)ppcVar7;
          iVar2 = X509_NAME_cmp((X509_NAME *)ppcVar7,pXVar24);
          if (iVar2 != 0) break;
          uVar3 = (int)ppcVar37 + 1;
          ppcVar37 = (char **)(ulong)uVar3;
          pFStack_19e0 = (FILE *)0x10dbaa;
          pFVar21 = pFVar19;
          iVar2 = OPENSSL_sk_num();
          pXVar8 = (X509 *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pXVar8;
      pXVar36 = localcert;
      if (localcert == (X509 *)0x0) {
        pFStack_19e0 = (FILE *)0x10dc7f;
        write_local_cert_cold_5();
      }
      else {
        ppcVar37 = &l_char;
        pFStack_19e0 = (FILE *)0x10dc00;
        pFVar21 = (FILE *)l_char;
        pFVar25 = fopen(l_char,"w");
        if (pFVar25 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_19e0 = (FILE *)0x10dc2a;
            printf("%s: certificate written as %s\n",pname,l_char);
          }
          if (d_flag != 0) {
            pFStack_19e0 = (FILE *)0x10dc4c;
            PEM_write_X509(_stdout,(X509 *)localcert);
          }
          pFStack_19e0 = (FILE *)0x10dc5b;
          pFVar21 = pFVar25;
          iVar2 = PEM_write_X509(pFVar25,(X509 *)localcert);
          pFVar19 = pFVar25;
          if (iVar2 == 1) {
            pFStack_19e0 = (FILE *)0x10dc68;
            iVar2 = fclose(pFVar25);
            return iVar2;
          }
          goto LAB_0010dc84;
        }
      }
      pFStack_19e0 = (FILE *)0x10dc84;
      write_local_cert_cold_4();
LAB_0010dc84:
      pFStack_19e0 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1a00 = &v_flag;
      uVar31 = *(undefined8 *)(*(long *)(pFVar21->__pad5 + 0x20) + 0x10);
      pFStack_1e18 = (FILE *)0x10dcb4;
      pFStack_1a08 = pFVar19;
      pXStack_19f8 = pXVar36;
      pXStack_19f0 = (X509_CRL *)ppcVar37;
      pFStack_19e8 = (FILE *)ppcVar7;
      pFStack_19e0 = pFVar20;
      iVar2 = OPENSSL_sk_num(uVar31);
      piVar4 = &v_flag;
      if (0 < iVar2) {
        pXVar36 = (X509 *)0x0;
        do {
          pFStack_1e18 = (FILE *)0x10dccd;
          pFVar19 = (FILE *)OPENSSL_sk_value(uVar31,pXVar36);
          pcVar34 = pname;
          if (v_flag != 0) {
            pFStack_1e18 = (FILE *)0x10dcee;
            pXVar24 = X509_get_subject_name((X509 *)pFVar19);
            pFStack_1e18 = (FILE *)0x10dcfe;
            pcVar12 = X509_NAME_oneline(pXVar24,(char *)aiStack_1e10,0x400);
            pFStack_1e18 = (FILE *)0x10dd12;
            printf("%s: found certificate with\n  subject: %s\n",pcVar34,pcVar12);
            pFStack_1e18 = (FILE *)0x10dd1a;
            pXVar24 = X509_get_issuer_name((X509 *)pFVar19);
            pFStack_1e18 = (FILE *)0x10dd2a;
            pcVar12 = X509_NAME_oneline(pXVar24,(char *)aiStack_1e10,0x400);
            pFStack_1e18 = (FILE *)0x10dd3b;
            printf("  issuer: %s\n",pcVar12);
            pFVar20 = (FILE *)pcVar34;
          }
          pFStack_1e18 = (FILE *)0x10dd43;
          x_00 = X509_get_serialNumber((X509 *)pFVar19);
          pFStack_1e18 = (FILE *)0x10dd56;
          iVar2 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar21->__pad3 + 8));
          piVar4 = aiStack_1e10;
          if (iVar2 == 0) goto LAB_0010dd73;
          uVar3 = (int)pXVar36 + 1;
          pXVar36 = (X509 *)(ulong)uVar3;
          pFStack_1e18 = (FILE *)0x10dd65;
          iVar2 = OPENSSL_sk_num(uVar31);
          piVar4 = aiStack_1e10;
        } while ((int)uVar3 < iVar2);
      }
      do {
        pFStack_1e18 = (FILE *)0x10dd73;
        write_other_cert_cold_3();
LAB_0010dd73:
      } while (pFVar19 == (FILE *)0x0);
      pFStack_1e18 = (FILE *)0x10dd8e;
      pFVar25 = (FILE *)w_char;
      pFVar33 = fopen(w_char,"w");
      if (pFVar33 == (FILE *)0x0) {
        pFStack_1e18 = (FILE *)0x10de0a;
        write_other_cert_cold_2();
      }
      else {
        if (v_flag != 0) {
          pFStack_1e18 = (FILE *)0x10ddbd;
          printf("%s: certificate written as %s\n",pname,w_char);
        }
        if (d_flag != 0) {
          pFStack_1e18 = (FILE *)0x10dddb;
          PEM_write_X509(_stdout,(X509 *)pFVar19);
        }
        pFStack_1e18 = (FILE *)0x10dde6;
        pFVar25 = pFVar33;
        iVar2 = PEM_write_X509(pFVar33,(X509 *)pFVar19);
        pFVar21 = pFVar33;
        if (iVar2 == 1) {
          pFStack_1e18 = (FILE *)0x10ddf3;
          iVar2 = fclose(pFVar33);
          return iVar2;
        }
      }
      pFStack_1e18 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      ppcStack_1e20 = &w_char;
      pFStack_1e40 = pFVar19;
      piStack_1e38 = piVar4;
      pXStack_1e30 = pXVar36;
      pFStack_1e28 = pFVar21;
      pFStack_1e18 = pFVar20;
      pBVar10 = BIO_new_mem_buf(pFVar25->_IO_read_end,*(int *)&pFVar25->_IO_read_base);
      pPVar17 = d2i_PKCS7_bio(pBVar10,(PKCS7 **)0x0);
      if (pPVar17 == (PKCS7 *)0x0) {
        pcVar34 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
        fprintf(_stderr,pcVar34,pname);
LAB_0010de66:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar17->type);
        if (iVar2 == 0x16) {
          lVar5 = ((pPVar17->d).data)->flags;
          if (lVar5 != 0) {
            pPStack_26a0 = pPVar17;
            pBStack_2698 = pBVar10;
            iVar2 = OPENSSL_sk_num(lVar5);
            if (0 < iVar2) {
              uVar11 = 0;
              lStack_2690 = lVar5;
              do {
                memset(acStack_2248,0,0x400);
                memset(acStack_2648,0,0x400);
                pXVar8 = (X509 *)OPENSSL_sk_value(lVar5,uVar11);
                snprintf(acStack_2648,0x400,"%s-%d",c_char,uVar11);
                pcVar34 = pname;
                if (v_flag != 0) {
                  pXVar24 = X509_get_subject_name(pXVar8);
                  pcVar12 = X509_NAME_oneline(pXVar24,acStack_2248,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar34,pcVar12);
                  if (v_flag != 0) {
                    pXVar24 = X509_get_issuer_name(pXVar8);
                    pcVar34 = X509_NAME_oneline(pXVar24,acStack_2248,0x400);
                    printf("  issuer: %s\n",pcVar34);
                  }
                }
                iVar2 = X509_digest(pXVar8,(EVP_MD *)fp_alg,abStack_2688,&uStack_26a4);
                if (iVar2 == 0) goto LAB_0010de66;
                iVar2 = X509_get_ext_by_NID(pXVar8,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar26 = X509_get_ext(pXVar8,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar26,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(pXVar8,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                    goto LAB_0010e0d7;
                  }
                }
                else {
                  pXVar26 = X509_get_ext(pXVar8,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar26,0,0);
                    putchar(10);
LAB_0010e0d7:
                    if (v_flag != 0) {
                      iVar2 = EVP_MD_get_type(fp_alg);
                      pcVar34 = OBJ_nid2sn(iVar2);
                      printf("  %s fingerprint: ",pcVar34);
                      uVar30 = (ulong)uStack_26a4;
                      if (0 < (int)uStack_26a4) {
                        uVar27 = 0;
                        do {
                          uVar1 = uVar27 + 1;
                          uVar31 = 10;
                          if (uVar1 != (uVar30 & 0xffffffff)) {
                            uVar31 = 0x3a;
                          }
                          printf("%02X%c",(ulong)abStack_2688[uVar27],uVar31);
                          uVar30 = (ulong)(int)uStack_26a4;
                          uVar27 = uVar1;
                        } while ((long)uVar1 < (long)uVar30);
                      }
                    }
                  }
                }
                pFVar20 = fopen(acStack_2648,"w");
                if (pFVar20 == (FILE *)0x0) {
                  pcVar34 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010dea6;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_2648);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,pXVar8);
                }
                iVar2 = PEM_write_X509(pFVar20,pXVar8);
                if (iVar2 != 1) {
                  pcVar34 = "%s: error while writing certificate file\n";
                  goto LAB_0010de5c;
                }
                fclose(pFVar20);
                lVar5 = lStack_2690;
                uVar3 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_2690);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_26a0);
            BIO_free(pBStack_2698);
            exit(0);
          }
          pcVar34 = "%s: cannot find certificates\n";
LAB_0010dea6:
          fprintf(_stderr,pcVar34,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_4e8 = (FILE *)0x10cf79;
  pkcs7_verify_unwrap_cold_9();
LAB_0010cf79:
  pFStack_4e8 = (FILE *)0x10cf91;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_4e8 = (FILE *)0x10cfa0;
  ERR_print_errors_fp(_stderr);
  pFStack_4e8 = (FILE *)0x10cfaa;
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s, int enc_base64) {
	BIO			*databio = NULL;
	BIO			*encbio = NULL;
	BIO			*pkcs7bio = NULL;
	BIO			*memorybio = NULL;
	BIO			*outbio = NULL;
	BIO			*base64bio = NULL;
	unsigned char		*buffer = NULL;
	int			rc, len = 0;
	int i=0;
	STACK_OF(X509)		*recipients;
	PKCS7			*p7enc;
	PKCS7_SIGNER_INFO	*si;
	STACK_OF(X509_ATTRIBUTE) *attributes;
	X509			*signercert = NULL;
	EVP_PKEY		*signerkey = NULL;

	/* Create a new sender nonce for all messages
	 * XXXXXXXXXXXXXX should it be per transaction? */
	s->sender_nonce_len = 16;
	s->sender_nonce = generate_nonce(s->sender_nonce_len);

	/* Prepare data payload */
	switch(s->request_type) {
		case SCEP_REQUEST_PKCSREQ:
			/*
			 * Set printable message type
			 * We set this later as an autheticated attribute
			 * "messageType".
			 */
			s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read request in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"certificate request in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}else{
				if (d_flag)
					printf("%s: inner PKCS#7 in mem BIO \n", pname);

			}
			break;

		case SCEP_REQUEST_GETCERTINIT:

			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio,
						s->ias_getcertinit)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCertInitial data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCERT:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERT_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcert)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCert data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCRL:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCRL_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcrl)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCRL data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}

			break;
	}


	if( BIO_flush(databio) <= 0 ){
		fprintf(stderr, "%s: error flushing databio\n", pname);
	}
	BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

	/* Below this is the common code for all request_type */

	/* Read in the payload */
	s->request_len = BIO_get_mem_data(databio, &s->request_payload);
	if (v_flag){
		printf("%s: request data dump \n", pname);
		PEM_write_X509_REQ(stdout, request);
	}

	if (v_flag)
		printf("%s: data payload size: %d bytes\n", pname,
				s->request_len);


	/* Create encryption certificate stack */
	if ((recipients = sk_X509_new(NULL)) == NULL) {
		fprintf(stderr, "%s: error creating "
					"certificate stack\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	/*
	 * Use different CA cert for encryption if requested.
	 * encert will be non-NULL if the -e option was specified on the command
	 * line, or if the certificates were auto-selected.
	 */
	if (encert != NULL) {
		if (sk_X509_push(recipients, encert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	/* Use same CA cert also for encryption */
	} else {
		if (sk_X509_push(recipients, cacert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	}

	/* Create BIO for encryption  */
	if (d_flag){
		printf("\n %s: hexdump request payload\n", pname);
		for(i=0; i < s->request_len; i++ ){
			printf("%02x", s->request_payload[i]);
		}
		printf("\n %s: hexdump payload %d \n", pname , i);

	}


	if ((encbio = BIO_new_mem_buf(s->request_payload,
				s->request_len)) == NULL) {
		fprintf(stderr, "%s: error creating data " "bio\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Encrypt */
	if (!(p7enc = PKCS7_encrypt(recipients, encbio,
					enc_alg, PKCS7_BINARY))) {
		fprintf(stderr, "%s: request payload encrypt failed\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: successfully encrypted payload\n", pname);

	/* Write encrypted data */
	memorybio = BIO_new(BIO_s_mem());
	if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
		fprintf(stderr, "%s: error writing encrypted data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	BIO_flush(memorybio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	len = BIO_get_mem_data(memorybio, &buffer);
	if (v_flag)
		printf("%s: envelope size: %d bytes\n", pname, len);
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, p7enc);
	}
	BIO_free(memorybio);

	/* Create outer PKCS#7  */
	if (v_flag)
		printf("%s: creating outer PKCS#7\n", pname);
	s->request_p7 = PKCS7_new();
	if (s->request_p7 == NULL) {
		fprintf(stderr, "%s: failed creating PKCS#7 for signing\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
		fprintf(stderr, "%s: failed setting PKCS#7 type\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Add signer certificate  and signature */
	PKCS7_add_certificate(s->request_p7, signercert);
	if ((si = PKCS7_add_signature(s->request_p7,
				signercert, signerkey, sig_alg)) == NULL) {
		fprintf(stderr, "%s: error adding PKCS#7 signature\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag)
		printf("%s: signature added successfully\n", pname);

	/* Set signed attributes */
	if (d_flag)
		printf("%s: adding signed attributes\n", pname);
	attributes = sk_X509_ATTRIBUTE_new_null();
	add_attribute_string(attributes, nid_transId, s->transaction_id);
	add_attribute_string(attributes, nid_messageType, s->request_type_str);
	add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce,
			s->sender_nonce_len);
	PKCS7_set_signed_attributes(si, attributes);
	/* Add contentType */
	if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType,
			V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
		fprintf(stderr, "%s: error adding NID_pkcs9_contentType\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Create new content */
	if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
		fprintf(stderr, "%s: failed setting PKCS#7 content type\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Write data  */
	pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: error opening bio for writing PKCS#7 "
			"data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (len != BIO_write(pkcs7bio, buffer, len)) {
		fprintf(stderr, "%s: error writing PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 data written successfully\n", pname);

	/* Finalize PKCS#7  */
	if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
		fprintf(stderr, "%s: error finalizing outer PKCS#7\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->request_p7);
	}

	/* base64-encode the data */
	if (v_flag && enc_base64)
		printf("%s: applying base64 encoding\n",pname);

	/* Create base64 filtering bio */
	memorybio = BIO_new(BIO_s_mem());
	base64bio = BIO_new(BIO_f_base64());
	if (enc_base64)
		outbio = BIO_push(base64bio, memorybio);
	else
		outbio = memorybio;

	/* Copy PKCS#7 */
	i2d_PKCS7_bio(outbio, s->request_p7);
	BIO_flush(outbio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
	if (v_flag)
		printf("%s: %spayload size: %d bytes\n",
				pname,
				enc_base64 ? "base64 encoded " : "",
				s->request_len);
	BIO_free(outbio);
	BIO_free(databio);
	return (0);
}